

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::anon_unknown_26::writeSourceInfo(JsonObjectWriter *writer,SourceLineInfo *sourceInfo)

{
  char *__s;
  size_t sVar1;
  StringRef value;
  JsonObjectWriter source_location_writer;
  char local_1c1;
  JsonObjectWriter local_1c0;
  undefined1 local_1a8 [400];
  uint64_t local_18;
  
  JsonObjectWriter::write((JsonObjectWriter *)local_1a8,(int)writer,"source-location",0xf);
  local_1c0.m_os = (ostream *)local_1a8._0_8_;
  local_1c0.m_indent_level = local_18;
  local_1c0.m_should_comma = false;
  local_1c0.m_active = true;
  local_1c1 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8._0_8_,&local_1c1,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1a8,(int)&local_1c0,"filename",8);
  __s = sourceInfo->file;
  sVar1 = strlen(__s);
  value.m_size = sVar1;
  value.m_start = __s;
  JsonValueWriter::writeImpl((JsonValueWriter *)local_1a8,value,true);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1a8,(int)&local_1c0,"line",4);
  JsonValueWriter::writeImpl<unsigned_long,void>
            ((JsonValueWriter *)local_1a8,&sourceInfo->line,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x88));
  JsonObjectWriter::~JsonObjectWriter(&local_1c0);
  return;
}

Assistant:

void writeSourceInfo( JsonObjectWriter& writer,
                              SourceLineInfo const& sourceInfo ) {
            auto source_location_writer =
                writer.write( "source-location"_sr ).writeObject();
            source_location_writer.write( "filename"_sr )
                .write( sourceInfo.file );
            source_location_writer.write( "line"_sr ).write( sourceInfo.line );
        }